

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_norm_impl(ggml_context *ctx,ggml_tensor *a,float eps,_Bool inplace)

{
  ggml_tensor *tensor;
  undefined7 in_register_00000011;
  float eps_local;
  
  if ((int)CONCAT71(in_register_00000011,inplace) == 0) {
    tensor = ggml_dup_tensor(ctx,a);
  }
  else {
    tensor = ggml_view_tensor(ctx,a);
  }
  ggml_set_op_params(tensor,&eps_local,4);
  tensor->op = GGML_OP_NORM;
  tensor->src[0] = a;
  return tensor;
}

Assistant:

static struct ggml_tensor * ggml_norm_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 eps,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    ggml_set_op_params(result, &eps, sizeof(eps));

    result->op     = GGML_OP_NORM;
    result->src[0] = a;

    return result;
}